

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QXmlStreamAttribute>::moveAppend
          (QGenericArrayOps<QXmlStreamAttribute> *this,QXmlStreamAttribute *b,QXmlStreamAttribute *e
          )

{
  QXmlStreamAttribute *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QXmlStreamAttribute>).ptr;
    qVar5 = (this->super_QArrayDataPointer<QXmlStreamAttribute>).size;
    do {
      pDVar2 = (b->m_name).m_string.d;
      (b->m_name).m_string.d = (Data *)0x0;
      pQVar1[qVar5].m_name.m_string.d = pDVar2;
      pcVar3 = (b->m_name).m_string.ptr;
      (b->m_name).m_string.ptr = (char16_t *)0x0;
      pQVar1[qVar5].m_name.m_string.ptr = pcVar3;
      qVar4 = (b->m_name).m_string.size;
      (b->m_name).m_string.size = 0;
      pQVar1[qVar5].m_name.m_string.size = qVar4;
      pDVar2 = (b->m_namespaceUri).m_string.d;
      (b->m_namespaceUri).m_string.d = (Data *)0x0;
      pQVar1[qVar5].m_namespaceUri.m_string.d = pDVar2;
      pcVar3 = (b->m_namespaceUri).m_string.ptr;
      (b->m_namespaceUri).m_string.ptr = (char16_t *)0x0;
      pQVar1[qVar5].m_namespaceUri.m_string.ptr = pcVar3;
      qVar4 = (b->m_namespaceUri).m_string.size;
      (b->m_namespaceUri).m_string.size = 0;
      pQVar1[qVar5].m_namespaceUri.m_string.size = qVar4;
      pDVar2 = (b->m_qualifiedName).m_string.d;
      (b->m_qualifiedName).m_string.d = (Data *)0x0;
      pQVar1[qVar5].m_qualifiedName.m_string.d = pDVar2;
      pcVar3 = (b->m_qualifiedName).m_string.ptr;
      (b->m_qualifiedName).m_string.ptr = (char16_t *)0x0;
      pQVar1[qVar5].m_qualifiedName.m_string.ptr = pcVar3;
      qVar4 = (b->m_qualifiedName).m_string.size;
      (b->m_qualifiedName).m_string.size = 0;
      pQVar1[qVar5].m_qualifiedName.m_string.size = qVar4;
      pDVar2 = (b->m_value).m_string.d;
      (b->m_value).m_string.d = (Data *)0x0;
      pQVar1[qVar5].m_value.m_string.d = pDVar2;
      pcVar3 = (b->m_value).m_string.ptr;
      (b->m_value).m_string.ptr = (char16_t *)0x0;
      pQVar1[qVar5].m_value.m_string.ptr = pcVar3;
      qVar4 = (b->m_value).m_string.size;
      (b->m_value).m_string.size = 0;
      pQVar1[qVar5].m_value.m_string.size = qVar4;
      pQVar1[qVar5].field_0x60 = pQVar1[qVar5].field_0x60 & 0xfe | b->field_0x60 & 1;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<QXmlStreamAttribute>).size + 1;
      (this->super_QArrayDataPointer<QXmlStreamAttribute>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }